

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * duckdb::StringUtil::Format<duckdb::SQLString>
                   (string *__return_storage_ptr__,string *fmt_str,SQLString *params)

{
  SQLString SStack_38;
  
  ::std::__cxx11::string::string((string *)&SStack_38,(string *)params);
  Exception::ConstructMessage<duckdb::SQLString>(__return_storage_ptr__,fmt_str,&SStack_38);
  ::std::__cxx11::string::~string((string *)&SStack_38);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}